

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderMatrixTests.cpp
# Opt level: O3

void deqp::gles3::Functional::MatrixCaseUtils::Evaluator<1,_6,_6>::evaluate
               (ShaderEvalContext *evalCtx,InputType in0Type,InputType in1Type)

{
  int row;
  long lVar1;
  float fVar2;
  Mat2x3 m_1;
  Mat2x3 m;
  Vector<float,_3> res;
  Matrix<float,_3,_2> local_88;
  Matrix<float,_3,_2> local_68;
  float afStack_50 [6];
  int aiStack_38 [6];
  float local_20 [6];
  
  if (in0Type == INPUTTYPE_DYNAMIC) {
    lVar1 = 0;
    do {
      fVar2 = 1.0;
      if (lVar1 != 0) {
        fVar2 = 0.0;
      }
      local_68.m_data.m_data[0].m_data[lVar1] = fVar2;
      fVar2 = 1.0;
      if (lVar1 != 1) {
        fVar2 = 0.0;
      }
      afStack_50[lVar1 + -3] = fVar2;
      lVar1 = lVar1 + 1;
    } while (lVar1 != 3);
    local_68.m_data.m_data[0].m_data._0_8_ = *(undefined8 *)evalCtx->in[0].m_data;
    local_68.m_data.m_data[1].m_data[0] = evalCtx->in[1].m_data[0];
    local_68.m_data.m_data[0].m_data[2] = evalCtx->in[0].m_data[2];
    local_68.m_data.m_data[1].m_data._4_8_ = *(undefined8 *)(evalCtx->in[1].m_data + 1);
  }
  else {
    local_68.m_data.m_data[0].m_data[0] = 0.0;
    local_68.m_data.m_data[0].m_data[1] = 0.0;
    local_68.m_data.m_data[0].m_data[2] = 0.0;
    local_68.m_data.m_data[1].m_data[0] = 0.0;
    local_68.m_data.m_data[1].m_data[1] = 0.0;
    local_68.m_data.m_data[1].m_data[2] = 0.0;
    lVar1 = 0;
    do {
      fVar2 = (float)(&DAT_01bf44a4)[lVar1 * 2];
      local_68.m_data.m_data[0].m_data[lVar1] = (float)(&s_constInMat2x3)[lVar1 * 2];
      afStack_50[lVar1 + -3] = fVar2;
      lVar1 = lVar1 + 1;
    } while (lVar1 != 3);
  }
  if (in1Type == INPUTTYPE_DYNAMIC) {
    lVar1 = 0;
    do {
      fVar2 = 1.0;
      if (lVar1 != 0) {
        fVar2 = 0.0;
      }
      local_88.m_data.m_data[0].m_data[lVar1] = fVar2;
      fVar2 = 1.0;
      if (lVar1 != 1) {
        fVar2 = 0.0;
      }
      local_88.m_data.m_data[1].m_data[lVar1] = fVar2;
      lVar1 = lVar1 + 1;
    } while (lVar1 != 3);
    local_88.m_data.m_data[0].m_data._0_8_ = *(undefined8 *)evalCtx->in[0].m_data;
    local_88.m_data.m_data[1].m_data[0] = evalCtx->in[1].m_data[0];
    local_88.m_data.m_data[0].m_data[2] = evalCtx->in[0].m_data[2];
    local_88.m_data.m_data[1].m_data._4_8_ = *(undefined8 *)(evalCtx->in[1].m_data + 1);
  }
  else {
    local_88.m_data.m_data[0].m_data[0] = 0.0;
    local_88.m_data.m_data[0].m_data[1] = 0.0;
    local_88.m_data.m_data[0].m_data[2] = 0.0;
    local_88.m_data.m_data[1].m_data[0] = 0.0;
    local_88.m_data.m_data[1].m_data[1] = 0.0;
    local_88.m_data.m_data[1].m_data[2] = 0.0;
    lVar1 = 0;
    do {
      fVar2 = (float)(&DAT_01bf44bc)[lVar1 * 2];
      local_88.m_data.m_data[0].m_data[lVar1] = (float)(&DAT_01bf44b8)[lVar1 * 2];
      local_88.m_data.m_data[1].m_data[lVar1] = fVar2;
      lVar1 = lVar1 + 1;
    } while (lVar1 != 3);
  }
  tcu::operator-(&local_68,&local_88);
  afStack_50[4] = 0.0;
  afStack_50[2] = 0.0;
  afStack_50[3] = 0.0;
  lVar1 = 0;
  do {
    afStack_50[lVar1 + 2] = local_20[lVar1] + local_20[lVar1 + 3];
    lVar1 = lVar1 + 1;
  } while (lVar1 != 3);
  aiStack_38[2] = 0;
  aiStack_38[3] = 1;
  aiStack_38[4] = 2;
  lVar1 = 2;
  do {
    (evalCtx->color).m_data[aiStack_38[lVar1]] = afStack_50[lVar1];
    lVar1 = lVar1 + 1;
  } while (lVar1 != 5);
  return;
}

Assistant:

static void evaluate (ShaderEvalContext& evalCtx, InputType in0Type, InputType in1Type)
	{
		typename TypeTraits<In0DataType>::Type	in0	= (in0Type == INPUTTYPE_DYNAMIC) ? getInputValue<INPUTTYPE_DYNAMIC, In0DataType>(evalCtx, 0)
																				     : getInputValue<INPUTTYPE_CONST,	In0DataType>(evalCtx, 0);
		typename TypeTraits<In1DataType>::Type	in1	= (in1Type == INPUTTYPE_DYNAMIC) ? getInputValue<INPUTTYPE_DYNAMIC, In1DataType>(evalCtx, 1)
																				     : getInputValue<INPUTTYPE_CONST,	In1DataType>(evalCtx, 1);
		evalCtx.color.xyz() = reduceToVec3(in0 - in1);
	}